

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O1

void fsnav_linal_mul_u(double *res,double *v,double *u,size_t m,size_t n)

{
  ulong uVar1;
  ulong uVar2;
  double *pdVar3;
  double *pdVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  bool bVar12;
  double dVar13;
  
  uVar2 = m * n;
  if (uVar2 != 0) {
    uVar5 = uVar2 - 1;
    pdVar3 = v + uVar2;
    do {
      if (n != 0) {
        uVar8 = 0;
        uVar1 = 0;
        pdVar4 = pdVar3;
        lVar11 = ((n + 1) * n >> 1) - 1;
        do {
          lVar9 = uVar5 - uVar1;
          res[lVar9] = v[lVar9] * u[lVar11];
          if (1 < n - uVar1) {
            lVar10 = ~uVar1 + lVar11;
            dVar13 = res[lVar9];
            uVar7 = 1;
            lVar6 = -2;
            do {
              dVar13 = dVar13 + pdVar4[lVar6] * u[lVar10];
              res[lVar9] = dVar13;
              uVar7 = uVar7 + 1;
              lVar10 = lVar10 + uVar8 + lVar6;
              lVar6 = lVar6 + -1;
            } while (uVar7 < n - uVar1);
          }
          lVar11 = lVar11 + uVar8 + -2;
          uVar8 = ~uVar1;
          uVar1 = uVar1 + 1;
          pdVar4 = pdVar4 + -1;
        } while (uVar1 != n);
      }
      bVar12 = n <= uVar5;
      uVar5 = uVar5 - n;
    } while ((bVar12) && (pdVar3 = pdVar3 + -n, uVar5 < uVar2));
  }
  return;
}

Assistant:

void fsnav_linal_mul_u(double* res, double* v, double* u, const size_t m, const size_t n)
{
	size_t 
		i, j, k, k0, r, r0, 
		nj, mn, nn1;

	mn = m*n;
	nn1 = n*(n+1)/2 - 1;
	for (r0 = mn-1; r0 < mn; r0 -= n) {
		for (j = 0, k0 = nn1; j < n; k0 -= j+2, j++) {
			r = r0 - j;
			nj = n - j;
			res[r] = v[r]*u[k0];
			for (i = 1, k = k0-j-1; i < nj; i++, k -= i+j)
				res[r] += v[r-i]*u[k];
		}
		if (r0 < n)
			break;
	}		
}